

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_String.cc
# Opt level: O2

ssize_t __thiscall Pl_String::write(Pl_String *this,int __fd,void *__buf,size_t __n)

{
  Pipeline *pPVar1;
  int iVar2;
  ssize_t in_RAX;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  
  if (__buf != (void *)0x0) {
    in_RAX = std::__cxx11::string::append
                       ((char *)((this->m)._M_t.
                                 super___uniq_ptr_impl<Pl_String::Members,_std::default_delete<Pl_String::Members>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Pl_String::Members_*,_std::default_delete<Pl_String::Members>_>
                                 .super__Head_base<0UL,_Pl_String::Members_*,_false>._M_head_impl)->
                                s,CONCAT44(in_register_00000034,__fd));
    pPVar1 = (this->super_Pipeline).next_;
    if (pPVar1 != (Pipeline *)0x0) {
      iVar2 = (*pPVar1->_vptr_Pipeline[2])(pPVar1,CONCAT44(in_register_00000034,__fd),__buf);
      return CONCAT44(extraout_var,iVar2);
    }
  }
  return in_RAX;
}

Assistant:

void
Pl_String::write(unsigned char const* buf, size_t len)
{
    if (!len) {
        return;
    }
    m->s.append(reinterpret_cast<char const*>(buf), len);
    if (next()) {
        next()->write(buf, len);
    }
}